

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O1

AmsNetId make_AmsNetId(string *addr)

{
  int iVar1;
  istream *piVar2;
  long lVar3;
  AmsNetId id;
  string s;
  istringstream iss;
  undefined8 local_1c8;
  char *local_1c0;
  undefined8 local_1b8;
  char local_1b0 [16];
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)addr,_S_in);
  local_1b8 = 0;
  local_1b0[0] = '\0';
  local_1c0 = local_1b0;
  AmsNetId::AmsNetId((AmsNetId *)&local_1c8,0);
  lVar3 = 0;
  do {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,(string *)&local_1c0,'.');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_00117986;
    iVar1 = atoi(local_1c0);
    *(char *)((long)&local_1c8 + lVar3) = (char)iVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  lVar3 = 6;
LAB_00117986:
  if (lVar3 == 6) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a0,(string *)&local_1c0,'.');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_001179bc;
  }
  local_1c8._4_4_ = local_1c8._4_4_ & 0xffff0000;
  local_1c8._0_4_ = 0;
LAB_001179bc:
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::ios_base::~ios_base(local_128);
  return (uint8_t  [6])((uint6)local_1c8._4_4_ << 0x20 | (uint6)(uint)local_1c8);
}

Assistant:

AmsNetId make_AmsNetId(const std::string& addr)
{
    std::istringstream iss(addr);
    std::string s;
    size_t i = 0;
    AmsNetId id {};

    while ((i < sizeof(id.b)) && std::getline(iss, s, '.')) {
        id.b[i] = atoi(s.c_str()) % 256;
        ++i;
    }

    if ((i != sizeof(id.b)) || std::getline(iss, s, '.')) {
        memset(id.b, 0, sizeof(id.b));
    }
    return id;
}